

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O2

void __thiscall
absl::BadStatusOrAccess::BadStatusOrAccess(BadStatusOrAccess *this,BadStatusOrAccess *other)

{
  *(undefined ***)this = &PTR__BadStatusOrAccess_001f0e58;
  Status::Status(&this->status_,&other->status_);
  (this->init_what_).control_.super___atomic_base<unsigned_int>._M_i = 0;
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  (this->what_)._M_string_length = 0;
  (this->what_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BadStatusOrAccess::BadStatusOrAccess(const BadStatusOrAccess& other)
    : status_(other.status_) {}